

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_mediator.hpp
# Opt level: O3

bool __thiscall iutest::TestInfo::Mediator::HasFatalFailure(Mediator *this)

{
  TestInfo *pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  bool bVar5;
  
  pTVar1 = (this->super_iuITestInfoMediator).m_test_info;
  pTVar2 = (pTVar1->m_test_result).m_test_part_results.
           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (pTVar1->m_test_result).m_test_part_results.
           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar2 == pTVar3) {
    return false;
  }
  do {
    pTVar4 = pTVar2 + 1;
    bVar5 = *(int *)&(pTVar2->super_iuCodeMessage).field_0x2c == 2;
    if (bVar5) {
      return bVar5;
    }
    pTVar2 = pTVar4;
  } while (pTVar4 != pTVar3);
  return bVar5;
}

Assistant:

TestInfo* ptr() const IUTEST_CXX_NOEXCEPT_SPEC { return m_test_info; }